

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O3

bool iDynTree::URDFFromModel(Model *model,string *urdf_filename,ModelExporterOptions *options)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  string xml_string;
  ofstream ofs;
  string local_2b0;
  undefined1 local_290 [40];
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(urdf_filename->_M_dataplus)._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[ERROR] iDynTree::URDFFromModel : error opening file ",0x35);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(urdf_filename->_M_dataplus)._M_p,
                        urdf_filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar3 = false;
  }
  else {
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
    pcVar1 = (options->baseLink)._M_dataplus._M_p;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    local_290._0_8_ = local_290 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_290,pcVar1,pcVar1 + (options->baseLink)._M_string_length);
    local_290[0x20] = options->exportFirstBaseLinkAdditionalFrameAsFakeURDFBase;
    pcVar1 = (options->robotExportedName)._M_dataplus._M_p;
    local_268._M_p = (pointer)&local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,pcVar1,pcVar1 + (options->robotExportedName)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_248,&options->xmlBlobs);
    bVar3 = URDFStringFromModel(model,&local_2b0,(ModelExporterOptions *)local_290);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != &local_258) {
      operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
      std::ofstream::close();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                               local_2b0.field_2._M_local_buf[0]) + 1);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _AccelerometerSensor;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return bVar3;
}

Assistant:

bool URDFFromModel(const iDynTree::Model & model,
                   const std::string & urdf_filename,
                   const ModelExporterOptions options)
{
    std::ofstream ofs(urdf_filename.c_str());

    if( !ofs.is_open() )
    {
        std::cerr << "[ERROR] iDynTree::URDFFromModel : error opening file "
                  << urdf_filename << std::endl;
        return false;
    }

    std::string xml_string;
    if (!URDFStringFromModel(model, xml_string, options))
    {
        return false;
    }

    // Write string to file
    ofs << xml_string;
    ofs.close();

    return true;
}